

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_string_ops.hpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* gmlc::utilities::
  generalized_string_split<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
            (basic_string_view<char,_std::char_traits<char>_> *str,
            basic_string_view<char,_std::char_traits<char>_> *delimiterCharacters,bool compress)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  byte in_CL;
  undefined8 *in_RDX;
  basic_string_view<char,_std::char_traits<char>_> *in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  size_type start;
  size_type pos;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ret;
  value_type *in_stack_fffffffffffffef8;
  value_type *__x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  undefined1 *in_stack_ffffffffffffff18;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff20;
  value_type local_c0;
  basic_string_view<char,_std::char_traits<char>_> local_a0;
  undefined8 local_90;
  undefined8 local_88;
  undefined1 local_80 [48];
  basic_string_view<char,_std::char_traits<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  undefined8 local_38;
  undefined8 local_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  undefined1 local_1a;
  byte local_19;
  undefined8 *local_18;
  basic_string_view<char,_std::char_traits<char>_> *local_10;
  
  local_19 = in_CL & 1;
  local_1a = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x7858a4);
  local_38 = *local_18;
  local_30 = local_18[1];
  __str._M_str = (char *)in_stack_ffffffffffffff10;
  __str._M_len = (size_t)in_stack_ffffffffffffff08;
  local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CLI::std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                       ((basic_string_view<char,_std::char_traits<char>_> *)
                        in_stack_ffffffffffffff00,__str,(size_type)in_stack_fffffffffffffef8);
  local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  while (local_28 !=
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xffffffffffffffff) {
    if (local_28 == local_40) {
      if ((local_19 & 1) == 0) {
        in_stack_ffffffffffffff18 = local_80;
        std::__cxx11::string::string(in_stack_ffffffffffffff10);
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
        std::__cxx11::string::~string(in_stack_ffffffffffffff00);
      }
    }
    else {
      bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        (in_stack_ffffffffffffff20,(size_type)in_stack_ffffffffffffff18,
                         (size_type)in_stack_ffffffffffffff10);
      in_stack_ffffffffffffff20 = (basic_string_view<char,_std::char_traits<char>_> *)bVar2._M_str;
      local_50 = bVar2;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::basic_string_view<char,std::char_traits<char>>>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    }
    local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&(local_28->_M_dataplus)._M_p + 1);
    local_90 = *local_18;
    local_88 = local_18[1];
    __str_00._M_str = (char *)in_stack_ffffffffffffff10;
    __str_00._M_len = (size_t)in_stack_ffffffffffffff08;
    local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CLI::std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                         ((basic_string_view<char,_std::char_traits<char>_> *)
                          in_stack_ffffffffffffff00,__str_00,(size_type)in_stack_fffffffffffffef8);
  }
  this = local_40;
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::basic_string_view<char,_std::char_traits<char>_>::length(local_10);
  if (this < pbVar1) {
    local_a0 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         (in_stack_ffffffffffffff20,(size_type)in_stack_ffffffffffffff18,
                          (size_type)this);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::basic_string_view<char,std::char_traits<char>>>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this,(basic_string_view<char,_std::char_traits<char>_> *)local_a0._M_len);
  }
  else if ((local_19 & 1) == 0) {
    __x = &local_c0;
    std::__cxx11::string::string(this);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffffff00,__x);
    std::__cxx11::string::~string(in_stack_ffffffffffffff00);
  }
  return in_RDI;
}

Assistant:

std::vector<XO> generalized_string_split(
    const X& str,
    const X& delimiterCharacters,
    bool compress)
{
    std::vector<XO> ret;

    auto pos = str.find_first_of(delimiterCharacters);
    decltype(pos) start = 0;
    while (pos != X::npos) {
        if (pos != start) {
            ret.emplace_back(str.substr(start, pos - start));
        } else if (!compress) {
            ret.push_back(XO());
        }
        start = pos + 1;
        pos = str.find_first_of(delimiterCharacters, start);
    }
    if (start < str.length()) {
        ret.emplace_back(str.substr(start));
    } else if (!compress) {
        ret.push_back(XO());
    }
    return ret;
}